

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> * __thiscall
Corrade::Utility::Configuration::parse
          (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>
           *__return_storage_ptr__,Configuration *this,StringView in,ConfigurationGroup *group,
          StringView fullPath)

{
  byte *pbVar1;
  pointer pVVar2;
  size_type sVar3;
  StringView SVar4;
  StringView prefix;
  StringView fullPath_00;
  undefined1 in_00 [16];
  _Alloc_hider _Var5;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *ppVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  type begin;
  StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *pcVar12;
  ostream *poVar13;
  ulong uVar14;
  string *psVar15;
  ulong uVar16;
  StringView b;
  StringView other;
  StringView in_01;
  StringView other_00;
  StringView other_01;
  StringView other_02;
  StringView other_03;
  StringView other_04;
  BasicStringView<const_char> BVar17;
  BasicStringView<const_char> BVar18;
  ArrayView<const_char> AVar19;
  StringView b_00;
  Value item;
  Array3<Containers::StringView> keyValue;
  StringView nextSubGroup;
  StringView nextGroup;
  undefined1 local_148 [16];
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  ConfigurationGroup *local_f0;
  StringView local_e8;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *local_d0;
  undefined1 local_c8 [32];
  BasicStringView<const_char> local_a8;
  BasicStringView<const_char> local_98;
  BasicStringView<const_char> local_88;
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  *local_78;
  anon_union_24_2_2c69c8ed_for_String_0 local_70;
  BasicStringView<const_char> local_50;
  BasicStringView<const_char> local_40;
  
  local_148._8_8_ = in._sizePlusFlags;
  SVar4 = in;
  local_f0 = group;
  local_d0 = __return_storage_ptr__;
  if ((fullPath._data != (char *)0x0) &&
     (SVar4 = in,
     ((undefined1  [16])fullPath & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0))
  {
    local_148 = (undefined1  [16])in;
    bVar7 = Containers::BasicStringView<const_char>::hasSuffix(&fullPath,'/');
    if (!bVar7) {
      poVar13 = Error::defaultOutput();
      Error::Error((Error *)local_138,poVar13,(Flags)0x0);
      Debug::operator<<((Debug *)local_138,
                        "Assertion !fullPath || fullPath.hasSuffix(\'/\') failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:125"
                       );
LAB_00116a80:
      Error::~Error((Error *)local_138);
      abort();
    }
    SVar4 = (StringView)local_148;
  }
  local_148 = (undefined1  [16])SVar4;
  uVar14 = local_148._8_8_ & 0x3fffffffffffffff;
  if (uVar14 != 0) {
    local_78 = &local_f0->_groups;
    bVar7 = false;
    uVar16 = local_148._8_8_;
    do {
      pcVar11 = (char *)local_148._0_8_;
      local_e8._data = (char *)local_148._0_8_;
      local_e8._sizePlusFlags = local_148._8_8_;
      begin = Containers::Implementation::stringFindCharacter();
      if (begin == (type)0x0) {
        pcVar12 = pcVar11 + uVar14;
        uVar14 = 0;
      }
      else {
        BVar17 = Containers::BasicStringView<const_char>::slice
                           ((BasicStringView<const_char> *)local_148,(char *)begin,
                            (char *)(begin + 1));
        pcVar12 = BVar17._data;
        uVar14 = BVar17._sizePlusFlags & 0x3fffffffffffffff;
      }
      if (pcVar12 == (char *)0x0) {
        local_e8 = (StringView)(ZEXT816(0x8000000000000000) << 0x40);
      }
      else {
        local_e8 = Containers::BasicStringView<const_char>::slice
                             ((BasicStringView<const_char> *)local_148,(char *)local_148._0_8_,
                              pcVar12);
      }
      local_148 = (undefined1  [16])
                  Containers::BasicStringView<const_char>::suffix
                            ((BasicStringView<const_char> *)local_148,pcVar12 + uVar14);
      bVar8 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,'\r');
      if (bVar8) {
        pbVar1 = (byte *)((long)&(this->_flags)._value + 2);
        *pbVar1 = *pbVar1 | 4;
      }
      if (bVar7) {
        local_138._0_8_ = local_e8._data;
        local_138._8_8_ = local_e8._sizePlusFlags;
        BVar17 = Containers::BasicStringView<const_char>::trimmed
                           ((BasicStringView<const_char> *)local_138);
        b._sizePlusFlags = 0xc000000000000003;
        b._data = "\"\"\"";
        other_02._sizePlusFlags = 0xc000000000000003;
        bVar8 = Containers::operator==(BVar17,b);
        if (bVar8) {
          pVVar2 = (local_f0->_values).
                   super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar3 = pVVar2[-1].value._M_string_length;
          if (sVar3 == 0) {
            bVar7 = false;
          }
          else {
            psVar15 = &pVVar2[-1].value;
            if ((psVar15->_M_dataplus)._M_p[sVar3 - 1] != '\n') {
              poVar13 = Error::defaultOutput();
              Error::Error((Error *)local_138,poVar13,(Flags)0x0);
              Debug::operator<<((Debug *)local_138,
                                "Assertion group->_values.back().value.back() == \'\\n\' failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:148"
                               );
              goto LAB_00116a80;
            }
            bVar7 = false;
            std::__cxx11::string::resize((ulong)psVar15,(char)sVar3 + -1);
          }
        }
        else {
          bVar8 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,'\r');
          if (bVar8) {
            local_e8 = Containers::BasicStringView<const_char>::slice
                                 (&local_e8,0,(local_e8._sizePlusFlags & 0x3fffffffffffffff) - 1);
          }
          other_01._data = (char *)local_e8._sizePlusFlags;
          other_01._sizePlusFlags = other_02._sizePlusFlags;
          Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::to((string *)local_138,
               (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8._data,other_01);
          std::__cxx11::string::_M_append
                    ((char *)&(local_f0->_values).
                              super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].value,local_138._0_8_);
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_);
          }
          std::__cxx11::string::push_back
                    ((char)(local_f0->_values).
                           super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x20);
        }
      }
      else {
        local_e8 = Containers::BasicStringView<const_char>::trimmed(&local_e8);
        if (local_e8._data == (char *)0x0 ||
            ((undefined1  [16])local_e8 & (undefined1  [16])0x3fffffffffffffff) ==
            (undefined1  [16])0x0) {
          if (((((this->_flags)._value & 0x10) == 0) && ((char *)local_148._0_8_ != (char *)0x0)) &&
             ((local_148 & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)) {
            std::
            vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ::emplace_back<>(&local_f0->_values);
          }
        }
        else {
          bVar8 = Containers::BasicStringView<const_char>::hasPrefix(&local_e8,'[');
          ppVar6 = local_d0;
          if (bVar8) {
            bVar8 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,']');
            if (!bVar8) {
              (ppVar6->first)._data = (char *)0x0;
              (ppVar6->first)._sizePlusFlags = 0x8000000000000000;
              pcVar12 = "missing closing bracket for a group header";
              goto LAB_001169b2;
            }
            local_138._0_16_ =
                 (undefined1  [16])
                 Containers::BasicStringView<const_char>::slice
                           (&local_e8,1,(local_e8._sizePlusFlags & 0x3fffffffffffffff) - 1);
            local_88 = Containers::BasicStringView<const_char>::trimmed
                                 ((BasicStringView<const_char> *)local_138);
            if ((local_88._data == (char *)0x0) ||
               (((undefined1  [16])local_88 & (undefined1  [16])0x3fffffffffffffff) ==
                (undefined1  [16])0x0)) {
              pcVar11 = (char *)0x0;
              uVar16 = 0x8000000000000000;
              pcVar12 = "empty group name";
            }
            else {
              SVar4._sizePlusFlags = fullPath._sizePlusFlags;
              SVar4._data = fullPath._data;
              bVar8 = Containers::BasicStringView<const_char>::hasPrefix(&local_88,SVar4);
              if (bVar8) {
                local_138._8_8_ = 0;
                local_138._0_8_ = local_138 + 0x10;
                local_138[0x10] = '\0';
                prefix._sizePlusFlags = fullPath._sizePlusFlags;
                prefix._data = fullPath._data;
                local_98 = Containers::BasicStringView<const_char>::exceptPrefix(&local_88,prefix);
                BVar17 = Containers::BasicStringView<const_char>::find(&local_98,'/');
                end = (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)BVar17._data;
                bVar8 = ((undefined1  [16])BVar17 & (undefined1  [16])0x3fffffffffffffff) !=
                        (undefined1  [16])0x0;
                other_02._sizePlusFlags =
                     CONCAT71(0x3fffffffffffff,
                              bVar8 && end != (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)0x0);
                if (bVar8 && end != (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)0x0) {
                  if (end == (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_98._data) {
                    AVar19 = (ArrayView<const_char>)(ZEXT816(0x8000000000000000) << 0x40);
                    pcVar11 = "empty subgroup name";
LAB_001169d3:
                    (local_d0->first)._data = AVar19._data;
                    (local_d0->first)._sizePlusFlags = AVar19._size;
                    local_d0->second = pcVar11;
                    if ((undefined1 *)local_138._0_8_ == local_138 + 0x10) {
                      return local_d0;
                    }
                    operator_delete((void *)local_138._0_8_);
                    return local_d0;
                  }
                  BVar18 = Containers::BasicStringView<const_char>::slice
                                     (&local_98,local_98._data,(char *)end);
                  other._data = (char *)BVar18._sizePlusFlags;
                  other._sizePlusFlags = other_02._sizePlusFlags;
                  Containers::Implementation::
                  StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::to((string *)local_c8,
                       (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)BVar18._data,other);
                  std::__cxx11::string::operator=((string *)local_138,(string *)local_c8);
                  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
                    operator_delete((void *)local_c8._0_8_);
                  }
                  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)operator_new(0x38);
                  ConfigurationGroup::ConfigurationGroup
                            ((ConfigurationGroup *)paVar10,
                             (this->super_ConfigurationGroup)._configuration);
                  local_118._M_p = (pointer)paVar10;
                  std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>
                            (local_78,(Group *)local_138);
                  _Var5._M_p = local_118._M_p;
                  local_50 = Containers::BasicStringView<const_char>::slice
                                       (&local_88,local_88._data,
                                        (char *)(end + (BVar17._sizePlusFlags & 0x3fffffffffffffff))
                                       );
                  in_01._sizePlusFlags = uVar16;
                  in_01._data = pcVar11;
                  parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)
                        local_c8,this,in_01,(ConfigurationGroup *)_Var5._M_p,local_50);
                  AVar19 = Containers::Implementation::
                           ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>
                           ::from((BasicStringView<const_char> *)local_c8);
                  pcVar11 = (char *)local_c8._16_8_;
                  if ((char *)local_c8._16_8_ != (char *)0x0) goto LAB_001169d3;
                  Containers::BasicStringView<const_char>::BasicStringView
                            ((BasicStringView<const_char> *)local_c8,AVar19._data,AVar19._size,
                             (StringViewFlags)0x0);
                  local_148._8_8_ = local_c8._8_8_;
                  local_148._0_8_ = local_c8._0_8_;
                }
                else {
                  other_02._data = (char *)local_98._sizePlusFlags;
                  Containers::Implementation::
                  StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::to((string *)local_c8,
                       (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_98._data,other_02);
                  std::__cxx11::string::operator=((string *)local_138,(string *)local_c8);
                  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
                    operator_delete((void *)local_c8._0_8_);
                  }
                  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)operator_new(0x38);
                  ConfigurationGroup::ConfigurationGroup
                            ((ConfigurationGroup *)paVar10,
                             (this->super_ConfigurationGroup)._configuration);
                  local_118._M_p = (pointer)paVar10;
                  std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>
                            (local_78,(Group *)local_138);
                  _Var5._M_p = local_118._M_p;
                  in_00 = local_148;
                  b_00._sizePlusFlags = 0xc000000000000001;
                  b_00._data = "/";
                  Containers::operator+((String *)&local_70._small,local_88,b_00);
                  AVar19 = Containers::String::operator_cast_to_ArrayView
                                     ((String *)&local_70._small);
                  Containers::BasicStringView<const_char>::BasicStringView
                            (&local_40,AVar19._data,AVar19._size,(StringViewFlags)0x0);
                  fullPath_00._sizePlusFlags = local_40._sizePlusFlags;
                  fullPath_00._data = local_40._data;
                  parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)
                        local_c8,this,(StringView)in_00,(ConfigurationGroup *)_Var5._M_p,fullPath_00
                       );
                  AVar19 = Containers::Implementation::
                           ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>
                           ::from((BasicStringView<const_char> *)local_c8);
                  pcVar11 = (char *)local_c8._16_8_;
                  Containers::String::~String((String *)&local_70._small);
                  if (pcVar11 != (char *)0x0) goto LAB_001169d3;
                  Containers::BasicStringView<const_char>::BasicStringView
                            ((BasicStringView<const_char> *)local_c8,AVar19._data,AVar19._size,
                             (StringViewFlags)0x0);
                  local_148._8_8_ = local_c8._8_8_;
                  local_148._0_8_ = local_c8._0_8_;
                }
                goto LAB_00116700;
              }
              pcVar12 = (char *)0x0;
            }
            (ppVar6->first)._data = pcVar11;
            (ppVar6->first)._sizePlusFlags = uVar16;
LAB_001169b2:
            ppVar6->second = pcVar12;
            return local_d0;
          }
          pcVar11 = Containers::BasicStringView<const_char>::operator[](&local_e8,0);
          if ((*pcVar11 == '#') ||
             (pcVar11 = Containers::BasicStringView<const_char>::operator[](&local_e8,0),
             *pcVar11 == ';')) {
            if (((this->_flags)._value & 0x10) == 0) {
              local_138._8_8_ = 0;
              local_138._0_8_ = local_138 + 0x10;
              local_138[0x10] = '\0';
              local_118._M_p = (pointer)&local_108;
              local_110 = (char *)0x0;
              local_108._M_local_buf[0] = '\0';
              other_00._sizePlusFlags = 0;
              other_00._data = (char *)local_e8._sizePlusFlags;
              Containers::Implementation::
              StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::to((string *)local_c8,
                   (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_e8._data,other_00);
              std::__cxx11::string::operator=((string *)&local_118,(string *)local_c8);
              if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
                operator_delete((void *)local_c8._0_8_);
              }
              std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::push_back(&local_f0->_values,(value_type *)local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_p != &local_108) {
                operator_delete(local_118._M_p);
              }
LAB_00116700:
              if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                operator_delete((void *)local_138._0_8_);
              }
            }
            goto LAB_001168e8;
          }
          Containers::BasicStringView<const_char>::partition
                    ((Array3<BasicStringView<const_char>_> *)local_c8,&local_e8,'=');
          if (((char *)local_c8._16_8_ == (char *)0x0) ||
             ((local_c8._24_8_ & 0x3fffffffffffffff) == 0)) {
            (ppVar6->first)._data = (char *)0x0;
            (ppVar6->first)._sizePlusFlags = 0x8000000000000000;
            pcVar12 = "missing equals for a value";
            goto LAB_001169b2;
          }
          other_02._sizePlusFlags = 0;
          local_138._8_8_ = 0;
          local_138._0_8_ = local_138 + 0x10;
          local_138[0x10] = '\0';
          local_118._M_p = (pointer)&local_108;
          local_110 = (char *)0x0;
          local_108._M_local_buf[0] = '\0';
          BVar17 = Containers::BasicStringView<const_char>::trimmed
                             ((BasicStringView<const_char> *)local_c8);
          other_03._data = (char *)BVar17._sizePlusFlags;
          other_03._sizePlusFlags = other_02._sizePlusFlags;
          Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::to((string *)&local_70._small,
               (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)BVar17._data,other_03);
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_70._small);
          if (local_70._large.data != local_70._small.data + 0x10) {
            operator_delete(local_70._large.data);
          }
          BVar17 = Containers::BasicStringView<const_char>::trimmed(&local_a8);
          other_04._data = (char *)BVar17._sizePlusFlags;
          other_04._sizePlusFlags = other_02._sizePlusFlags;
          Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::to((string *)&local_70._small,
               (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)BVar17._data,other_04);
          std::__cxx11::string::operator=((string *)&local_118,(string *)&local_70._small);
          if (local_70._large.data != local_70._small.data + 0x10) {
            operator_delete(local_70._large.data);
          }
          iVar9 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar9 == 0) {
            bVar7 = true;
            std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110,0x132496);
LAB_001168a7:
            std::
            vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ::push_back(&local_f0->_values,(value_type *)local_138);
            bVar8 = true;
          }
          else {
            if ((local_110 == (char *)0x0) || (*local_118._M_p != '\"')) goto LAB_001168a7;
            if ((local_110 != (char *)0x1) && ((local_118._M_p + -1)[(long)local_110] == '\"')) {
              std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_118);
              std::__cxx11::string::operator=((string *)&local_118,(string *)&local_70._small);
              if (local_70._large.data != local_70._small.data + 0x10) {
                operator_delete(local_70._large.data);
              }
              goto LAB_001168a7;
            }
            (ppVar6->first)._data = (char *)0x0;
            (ppVar6->first)._sizePlusFlags = 0x8000000000000000;
            ppVar6->second = "missing closing quote for a value";
            bVar8 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_p != &local_108) {
            operator_delete(local_118._M_p);
          }
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_);
          }
          if (!bVar8) {
            return local_d0;
          }
        }
      }
LAB_001168e8:
      uVar14 = local_148._8_8_ & 0x3fffffffffffffff;
      uVar16 = local_148._8_8_;
    } while ((local_148 & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0);
    if (bVar7) {
      (local_d0->first)._data = (char *)0x0;
      (local_d0->first)._sizePlusFlags = 0x8000000000000000;
      local_d0->second = "missing closing quotes for a multi-line value";
      return local_d0;
    }
  }
  (local_d0->first)._data = (char *)local_148._0_8_;
  (local_d0->first)._sizePlusFlags = local_148._8_8_;
  local_d0->second = (char *)0x0;
  return local_d0;
}

Assistant:

std::pair<Containers::StringView, const char*> Configuration::parse(Containers::StringView in, ConfigurationGroup* group, const Containers::StringView fullPath) {
    CORRADE_INTERNAL_ASSERT(!fullPath || fullPath.hasSuffix('/'));

    /* Parse file */
    bool multiLineValue = false;
    while(!in.isEmpty()) {
        const Containers::StringView currentLine = in;

        /* Extract the line and ignore the newline character after it, if any */
        Containers::StringView buffer = in;
        const Containers::StringView end = in.findOr('\n', in.end());
        buffer = in.prefix(end.begin());
        in = in.suffix(end.end());

        /* Windows EOL */
        if(buffer.hasSuffix('\r'))
            _flags |= InternalFlag::WindowsEol;

        /* Multi-line value */
        if(multiLineValue) {
            /* End of multi-line value */
            if(Containers::StringView{buffer}.trimmed() == "\"\"\""_s) {
                /* Remove trailing newline, if present */
                if(!group->_values.back().value.empty()) {
                    CORRADE_INTERNAL_ASSERT(group->_values.back().value.back() == '\n');
                    group->_values.back().value.resize(group->_values.back().value.size()-1);
                }

                multiLineValue = false;
                continue;
            }

            /* Remove Windows EOL, if present */
            if(buffer.hasSuffix('\r')) buffer = buffer.exceptSuffix(1);

            /* Append it (with newline) to current value */
            group->_values.back().value += buffer;
            group->_values.back().value += '\n';
            continue;
        }

        /* Trim buffer */
        buffer = buffer.trimmed();

        /* Empty line */
        if(!buffer) {
            if(_flags & InternalFlag::SkipComments) continue;

            /* Save it only if this is not the last one */
            if(in) group->_values.emplace_back();

        /* Group header */
        } else if(buffer.hasPrefix('[')) {

            /* Check ending bracket */
            if(!buffer.hasSuffix(']'))
                return {nullptr, "missing closing bracket for a group header"};

            const Containers::StringView nextGroup = buffer.slice(1, buffer.size()-1).trimmed();

            if(!nextGroup)
                return {nullptr, "empty group name"};

            /* This is a subgroup of this one, parse recursively */
            if(nextGroup.hasPrefix(fullPath)) {
                ConfigurationGroup::Group g;

                /* If the subgroup has a shorthand for multiple nesting, call
                   parse() on this same line again but with nested group and
                   larger fullPath */
                const Containers::StringView nextSubGroup = nextGroup.exceptPrefix(fullPath);
                if(const Containers::StringView groupEnd = nextSubGroup.find('/')) {
                    if(groupEnd.begin() == nextSubGroup.begin())
                        return {nullptr, "empty subgroup name"};

                    g.name = nextSubGroup.prefix(groupEnd.begin());
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(currentLine, g.group, nextGroup.prefix(groupEnd .end()));
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;

                /* Otherwise call parse() on the next line */
                } else {
                    g.name = nextSubGroup;
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(in, g.group, nextGroup + "/"_s);
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;
                }

            /* Otherwise it's a subgroup of some parent, return the control
               back to caller (again with this line) */
            } else return {currentLine, nullptr};

        /* Comment */
        } else if(buffer[0] == '#' || buffer[0] == ';') {
            if(_flags & InternalFlag::SkipComments) continue;

            ConfigurationGroup::Value item;
            item.value = buffer;
            group->_values.push_back(item);

        /* Key/value pair */
        } else {
            const Containers::Array3<Containers::StringView> keyValue = buffer.partition('=');
            if(!keyValue[1])
                return {nullptr, "missing equals for a value"};

            ConfigurationGroup::Value item;
            item.key = keyValue[0].trimmed();
            item.value = keyValue[2].trimmed();

            /* Start of multi-line value */
            if(item.value == "\"\"\"") {
                item.value = "";
                multiLineValue = true;

            /* Remove quotes, if present */
            /** @todo Check `"` characters better */
            } else if(!item.value.empty() && item.value[0] == '"') {
                if(item.value.size() < 2 || item.value[item.value.size()-1] != '"')
                    return {nullptr, "missing closing quote for a value"};

                item.value = item.value.substr(1, item.value.size()-2);
            }

            group->_values.push_back(item);
        }
    }

    if(multiLineValue)
        return {nullptr, "missing closing quotes for a multi-line value"};

    /* This was the last group */
    return {in, nullptr};
}